

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_dischargevars(FuncState *fs,expdesc *e)

{
  uint a;
  int iVar1;
  ulong uVar2;
  FuncState *in_RSI;
  FuncState *in_RDI;
  
  a = *(int *)&in_RSI->f - 6;
  uVar2 = (ulong)a;
  switch(uVar2) {
  case 0:
    *(undefined4 *)&in_RSI->f = 0xc;
    break;
  case 1:
    iVar1 = luaK_codeABC(in_RSI,OP_MOVE,a,0,0x116218);
    *(int *)&in_RSI->h = iVar1;
    *(undefined4 *)&in_RSI->f = 0xb;
    break;
  case 2:
    iVar1 = luaK_codeABx(in_RSI,OP_MOVE,a,0);
    *(int *)&in_RSI->h = iVar1;
    *(undefined4 *)&in_RSI->f = 0xb;
    break;
  case 3:
    freereg(in_RDI,*(int *)((long)&in_RSI->h + 4));
    freereg(in_RDI,*(int *)&in_RSI->h);
    iVar1 = luaK_codeABC(in_RSI,(OpCode)(uVar2 >> 0x20),(int)uVar2,0,0x1162a8);
    *(int *)&in_RSI->h = iVar1;
    *(undefined4 *)&in_RSI->f = 0xb;
    break;
  default:
    break;
  case 7:
  case 8:
    luaK_setoneret(in_RDI,(expdesc *)in_RSI);
  }
  return;
}

Assistant:

static void luaK_dischargevars(FuncState*fs,expdesc*e){
switch(e->k){
case VLOCAL:{
e->k=VNONRELOC;
break;
}
case VUPVAL:{
e->u.s.info=luaK_codeABC(fs,OP_GETUPVAL,0,e->u.s.info,0);
e->k=VRELOCABLE;
break;
}
case VGLOBAL:{
e->u.s.info=luaK_codeABx(fs,OP_GETGLOBAL,0,e->u.s.info);
e->k=VRELOCABLE;
break;
}
case VINDEXED:{
freereg(fs,e->u.s.aux);
freereg(fs,e->u.s.info);
e->u.s.info=luaK_codeABC(fs,OP_GETTABLE,0,e->u.s.info,e->u.s.aux);
e->k=VRELOCABLE;
break;
}
case VVARARG:
case VCALL:{
luaK_setoneret(fs,e);
break;
}
default:break;
}
}